

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lehrfem_info.cc
# Opt level: O3

void lf::base::LehrFemInfo::PrintInfo(ostream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string version_datetime;
  size_type __dnew;
  size_type __dnew_2;
  string version;
  size_type __dnew_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_d8.field_2;
  local_b8._M_dataplus._M_p = (pointer)0x28;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_d8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_d8,(size_type *)&local_b8,0);
  _Var3._M_p = local_b8._M_dataplus._M_p;
  local_d8.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
  builtin_strncpy(local_d8._M_dataplus._M_p,"b4d6343a502b285f4653f2fa7166549cdfcefffd",0x28);
  local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p[local_b8._M_dataplus._M_p] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_b8._M_dataplus._M_p + 1));
  }
  if (_Var3._M_p == (pointer)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_78,0,local_78._M_string_length,"unknown",7);
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)0x28;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    local_d8._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_d8,(size_type *)&local_b8,0);
    local_d8.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
    builtin_strncpy(local_d8._M_dataplus._M_p,"b4d6343a502b285f4653f2fa7166549cdfcefffd",0x28);
    local_d8._M_string_length = (size_type)local_b8._M_dataplus._M_p;
    local_d8._M_dataplus._M_p[local_b8._M_dataplus._M_p] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_78,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (&local_78,local_78._M_string_length,0x38 - local_78._M_string_length,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_78,"|\n");
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity =
       local_d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  paVar2 = &local_b8.field_2;
  local_98._M_dataplus._M_p = (pointer)0x19;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  local_b8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_b8,(size_type *)&local_98,0);
  _Var3._M_p = local_98._M_dataplus._M_p;
  local_b8.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 9) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 10) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xb) = '2';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xc) = '1';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xd) = ':';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xe) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xf) = '2';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x10) = ':';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x11) = '5';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x12) = '9';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x13) = '+';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x14) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x15) = '1';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x16) = ':';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x17) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0x18) = '0';
  *(undefined8 *)local_b8._M_dataplus._M_p = 0x2d33302d35323032;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 8) = '1';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 9) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 10) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xb) = '2';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xc) = '1';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xd) = ':';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xe) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p + 0xf) = '2';
  local_b8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_b8._M_dataplus._M_p[local_98._M_dataplus._M_p] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_98._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_58 = 0x19;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_50,&local_58,0);
    local_50.field_2._M_allocated_capacity = local_58;
    builtin_strncpy(local_50._M_dataplus._M_p,"2025-03-10T21:02:59+01:00",0x19);
    local_50._M_string_length = local_58;
    local_50._M_dataplus._M_p[local_58] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0,"(",1);
    local_98._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar5) {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_98,")");
    local_b8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar5) {
      local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_b8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_b8._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_d8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (&local_d8,local_d8._M_string_length,0x38 - local_d8._M_string_length,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_d8,"|\n");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"+------------------------------------------------------------------+",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|        __         __         ______________  ___                 |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|       / /   ___  / /_  _____/ ____/ ____/  |/  / __    __        |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|      / /   / _ \\/ __ \\/ ___/ /_  / __/ / /|_/ /_/ /___/ /_       |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|     / /___/  __/ / / / /  / __/ / /___/ /  / /_  __/_  __/       |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|    /_____/\\___/_/ /_/_/  /_/   /_____/_/  /_/ /_/   /_/          |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|                                                                  |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|                                                                  |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"| Maintained by Raffael Casagrande and Ralf Hiptmair with          |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"| contributions from many other people.                            |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|                                                                  |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"| Version: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"|          ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"|  Source: https://github.com/craffael/lehrfempp                   |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"| License: MIT License                                             |",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"+------------------------------------------------------------------+",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void LehrFemInfo::PrintInfo(std::ostream &stream) {
  std::string version;
  if (!getVersionTag().empty()) {
    version = getVersionTag();
  } else if (!getVersionSha().empty()) {
    version = getVersionSha();
  } else {
    version = "unknown";
  }
  version.insert(version.size(), 56 - version.size(), ' ');
  version += "|\n";

  std::string version_datetime;
  if (!getVersionDateTime().empty()) {
    version_datetime = "(" + getVersionDateTime() + ")";
  }

  version_datetime.insert(version_datetime.size(), 56 - version_datetime.size(),
                          ' ');
  version_datetime += "|\n";

  // clang-format off
  stream << "\n";
  stream << R"foo(+------------------------------------------------------------------+)foo" << "\n";
  stream << R"foo(|        __         __         ______________  ___                 |)foo" << "\n";
  stream << R"foo(|       / /   ___  / /_  _____/ ____/ ____/  |/  / __    __        |)foo" << "\n";
  stream << R"foo(|      / /   / _ \/ __ \/ ___/ /_  / __/ / /|_/ /_/ /___/ /_       |)foo" << "\n";
  stream << R"foo(|     / /___/  __/ / / / /  / __/ / /___/ /  / /_  __/_  __/       |)foo" << "\n";
  stream << R"foo(|    /_____/\___/_/ /_/_/  /_/   /_____/_/  /_/ /_/   /_/          |)foo" << "\n";
  stream << R"foo(|                                                                  |)foo" << "\n";
  stream << R"foo(|                                                                  |)foo" << "\n";
  stream << R"foo(| Maintained by Raffael Casagrande and Ralf Hiptmair with          |)foo" << "\n";
  stream << R"foo(| contributions from many other people.                            |)foo" << "\n";
  stream << R"foo(|                                                                  |)foo" << "\n";
  stream << R"foo(| Version: )foo" << version;           
  stream << R"foo(|          )foo" << version_datetime;
  stream << R"foo(|  Source: https://github.com/craffael/lehrfempp                   |)foo" << "\n";
  stream << R"foo(| License: MIT License                                             |)foo" << "\n";
  stream << R"foo(+------------------------------------------------------------------+)foo" << "\n";
  stream << "\n";
  // clang-format on
}